

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

int MOJOSHADER_maxShaderModel(char *profile)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = strcmp(profile,"d3d");
  uVar2 = 3;
  uVar3 = uVar2;
  if ((((iVar1 != 0) && (iVar1 = strcmp(profile,"bytecode"), iVar1 != 0)) &&
      (iVar1 = strcmp(profile,"glsl"), iVar1 != 0)) &&
     ((iVar1 = strcmp(profile,"glsl120"), iVar1 != 0 &&
      (iVar1 = strcmp(profile,"glsles"), iVar1 != 0)))) {
    iVar1 = strcmp(profile,"arb1");
    uVar3 = 2;
    if (((iVar1 != 0) &&
        ((iVar1 = strcmp(profile,"nv2"), iVar1 != 0 && (iVar1 = strcmp(profile,"nv3"), iVar1 != 0)))
        ) && (iVar1 = strcmp(profile,"nv4"), uVar3 = uVar2, iVar1 != 0)) {
      iVar1 = strcmp(profile,"metal");
      uVar3 = -(uint)(iVar1 != 0) | 3;
    }
  }
  return uVar3;
}

Assistant:

int MOJOSHADER_maxShaderModel(const char *profile)
{
    #define PROFILE_SHADER_MODEL(p,v) if (strcmp(profile, p) == 0) return v;
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_D3D, 3);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_BYTECODE, 3);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_GLSL, 3);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_GLSL120, 3);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_GLSLES, 3);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_ARB1, 2);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_NV2, 2);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_NV3, 2);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_NV4, 3);
    PROFILE_SHADER_MODEL(MOJOSHADER_PROFILE_METAL, 3);
    #undef PROFILE_SHADER_MODEL
    return -1;  // unknown profile?
}